

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<kj::_::DebugComparison<char_const(&)[5],capnp::Text::Reader>&>
          (String *__return_storage_ptr__,kj *this,
          DebugComparison<const_char_(&)[5],_capnp::Text::Reader> *params)

{
  DebugComparison<const_char_(&)[5],_capnp::Text::Reader> *this_00;
  DebugComparison<const_char_(&)[5],_capnp::Text::Reader> *value;
  String local_30;
  kj *local_18;
  DebugComparison<const_char_(&)[5],_capnp::Text::Reader> *params_local;
  
  local_18 = this;
  params_local = (DebugComparison<const_char_(&)[5],_capnp::Text::Reader> *)__return_storage_ptr__;
  this_00 = fwd<kj::_::DebugComparison<char_const(&)[5],capnp::Text::Reader>&>
                      ((DebugComparison<const_char_(&)[5],_capnp::Text::Reader> *)this);
  toCharSequence<kj::_::DebugComparison<char_const(&)[5],capnp::Text::Reader>&>
            (&local_30,(kj *)this_00,value);
  _::concat(__return_storage_ptr__,&local_30);
  String::~String(&local_30);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}